

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseF32(WastParser *this,Const *const_,ConstType const_type)

{
  Result RVar1;
  ExpectedNan expected;
  uint32_t f32_bits;
  ExpectedNan local_5c;
  Token local_58;
  
  if ((const_type == Expectation) && (RVar1 = ParseExpectedNan(this,&local_5c), RVar1.enum_ == Ok))
  {
    (const_->type_).enum_ = F32;
    (const_->data_).v[0] = '\0';
    (const_->data_).v[1] = '\0';
    (const_->data_).v[2] = '\0';
    (const_->data_).v[3] = '\0';
    const_->nan_[0] = local_5c;
    return (Result)Ok;
  }
  Consume(&local_58,this);
  if (local_58.token_type_ - First_Literal < 3) {
    RVar1 = ParseFloat(local_58.field_2.literal_.type,local_58.field_2.literal_.text.data_,
                       local_58.field_2.literal_.text.data_ + local_58.field_2.literal_.text.size_,
                       (uint32_t *)&local_58);
    (const_->type_).enum_ = F32;
    *(undefined4 *)(const_->data_).v = local_58.loc.filename.data_._0_4_;
    const_->nan_[0] = None;
    return (Result)RVar1.enum_;
  }
  __assert_fail("HasLiteral()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/token.h",
                0x71,"const Literal &wabt::Token::literal() const");
}

Assistant:

Result WastParser::ParseF32(Const* const_, ConstType const_type) {
  ExpectedNan expected;
  if (const_type == ConstType::Expectation &&
      Succeeded(ParseExpectedNan(&expected))) {
    const_->set_f32(expected);
    return Result::Ok;
  }
  auto literal = Consume().literal();
  uint32_t f32_bits;
  Result result = ParseFloat(literal.type, literal.text.begin(),
                             literal.text.end(), &f32_bits);
  const_->set_f32(f32_bits);
  return result;
}